

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestVat> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::_::(anonymous_namespace)::TestVat> *this_local;
  
  if (pointer != (void *)0x0) {
    ::capnp::_::anon_unknown_0::TestVat::~TestVat((TestVat *)pointer);
    operator_delete(pointer,0x290);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }